

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::onErrorResponse
          (ClientConductor *this,int64_t offendingCommandCorrelationId,int32_t errorCode,
          string *errorMessage)

{
  pointer pSVar1;
  pointer pPVar2;
  pointer pEVar3;
  pointer pCVar4;
  long lVar5;
  long lVar6;
  pointer pSVar7;
  pointer pPVar8;
  pointer pCVar9;
  pointer pEVar10;
  pointer pPVar11;
  pointer pEVar12;
  
  std::recursive_mutex::lock(&this->m_adminLock);
  pSVar7 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pSVar1 - (long)pSVar7;
  for (lVar5 = lVar6 / 0xc0 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pSVar7->m_registrationId == offendingCommandCorrelationId) goto LAB_0016098f;
    if (pSVar7[1].m_registrationId == offendingCommandCorrelationId) {
      pSVar7 = pSVar7 + 1;
      goto LAB_0016098f;
    }
    if (pSVar7[2].m_registrationId == offendingCommandCorrelationId) {
      pSVar7 = pSVar7 + 2;
      goto LAB_0016098f;
    }
    if (pSVar7[3].m_registrationId == offendingCommandCorrelationId) {
      pSVar7 = pSVar7 + 3;
      goto LAB_0016098f;
    }
    pSVar7 = pSVar7 + 4;
    lVar6 = lVar6 + -0x300;
  }
  lVar6 = lVar6 / 0xc0;
  if (lVar6 == 1) {
LAB_0016096c:
    if (pSVar7->m_registrationId != offendingCommandCorrelationId) {
      pSVar7 = pSVar1;
    }
LAB_0016098f:
    if (pSVar7 != pSVar1) {
      pSVar7->m_status = ERRORED_MEDIA_DRIVER;
      pSVar7->m_errorCode = errorCode;
      std::__cxx11::string::_M_assign((string *)&pSVar7->m_errorMessage);
      goto LAB_00160c4c;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_0016095f:
      if (pSVar7->m_registrationId != offendingCommandCorrelationId) {
        pSVar7 = pSVar7 + 1;
        goto LAB_0016096c;
      }
      goto LAB_0016098f;
    }
    if (lVar6 == 3) {
      if (pSVar7->m_registrationId != offendingCommandCorrelationId) {
        pSVar7 = pSVar7 + 1;
        goto LAB_0016095f;
      }
      goto LAB_0016098f;
    }
  }
  pPVar11 = (this->m_publications).
            super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pPVar2 - (long)pPVar11;
  pPVar11 = pPVar11 + 2;
  for (lVar5 = lVar6 / 0x90 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pPVar11[-2].m_registrationId == offendingCommandCorrelationId) {
      pPVar8 = pPVar11 + -2;
      goto LAB_00160a5c;
    }
    if (pPVar11[-1].m_registrationId == offendingCommandCorrelationId) {
      pPVar8 = pPVar11 + -1;
      goto LAB_00160a5c;
    }
    pPVar8 = pPVar11;
    if (pPVar11->m_registrationId == offendingCommandCorrelationId) goto LAB_00160a5c;
    if (pPVar11[1].m_registrationId == offendingCommandCorrelationId) {
      pPVar8 = pPVar11 + 1;
      goto LAB_00160a5c;
    }
    pPVar11 = pPVar11 + 4;
    lVar6 = lVar6 + -0x240;
  }
  lVar6 = lVar6 / 0x90;
  pPVar8 = pPVar11 + -2;
  if (lVar6 == 1) {
LAB_00160bd9:
    if (pPVar8->m_registrationId != offendingCommandCorrelationId) {
      pPVar8 = pPVar2;
    }
LAB_00160a5c:
    if (pPVar8 != pPVar2) {
      pPVar8->m_status = ERRORED_MEDIA_DRIVER;
      pPVar8->m_errorCode = errorCode;
      std::__cxx11::string::_M_assign((string *)&pPVar8->m_errorMessage);
      goto LAB_00160c4c;
    }
  }
  else {
    if (lVar6 == 3) {
      if (pPVar11[-2].m_registrationId != offendingCommandCorrelationId) {
        pPVar8 = pPVar11 + -1;
        goto LAB_00160bc8;
      }
      goto LAB_00160a5c;
    }
    if (lVar6 == 2) {
LAB_00160bc8:
      if (pPVar8->m_registrationId != offendingCommandCorrelationId) {
        pPVar8 = pPVar8 + 1;
        goto LAB_00160bd9;
      }
      goto LAB_00160a5c;
    }
  }
  pEVar12 = (this->m_exclusivePublications).
            super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pEVar3 - (long)pEVar12;
  pEVar12 = pEVar12 + 2;
  for (lVar5 = lVar6 / 0x90 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pEVar12[-2].m_registrationId == offendingCommandCorrelationId) {
      pEVar10 = pEVar12 + -2;
      goto LAB_00160b29;
    }
    if (pEVar12[-1].m_registrationId == offendingCommandCorrelationId) {
      pEVar10 = pEVar12 + -1;
      goto LAB_00160b29;
    }
    pEVar10 = pEVar12;
    if (pEVar12->m_registrationId == offendingCommandCorrelationId) goto LAB_00160b29;
    if (pEVar12[1].m_registrationId == offendingCommandCorrelationId) {
      pEVar10 = pEVar12 + 1;
      goto LAB_00160b29;
    }
    pEVar12 = pEVar12 + 4;
    lVar6 = lVar6 + -0x240;
  }
  lVar6 = lVar6 / 0x90;
  pEVar10 = pEVar12 + -2;
  if (lVar6 == 1) {
LAB_00160c84:
    if (pEVar10->m_registrationId != offendingCommandCorrelationId) {
      pEVar10 = pEVar3;
    }
LAB_00160b29:
    if (pEVar10 != pEVar3) {
      pEVar10->m_status = ERRORED_MEDIA_DRIVER;
      pEVar10->m_errorCode = errorCode;
      std::__cxx11::string::_M_assign((string *)&pEVar10->m_errorMessage);
      goto LAB_00160c4c;
    }
  }
  else {
    if (lVar6 == 3) {
      if (pEVar12[-2].m_registrationId != offendingCommandCorrelationId) {
        pEVar10 = pEVar12 + -1;
        goto LAB_00160c73;
      }
      goto LAB_00160b29;
    }
    if (lVar6 == 2) {
LAB_00160c73:
      if (pEVar10->m_registrationId != offendingCommandCorrelationId) {
        pEVar10 = pEVar10 + 1;
        goto LAB_00160c84;
      }
      goto LAB_00160b29;
    }
  }
  pCVar9 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pCVar4 - (long)pCVar9;
  for (lVar5 = lVar6 / 0x60 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pCVar9->m_registrationId == offendingCommandCorrelationId) goto LAB_00160c31;
    if (pCVar9[1].m_registrationId == offendingCommandCorrelationId) {
      pCVar9 = pCVar9 + 1;
      goto LAB_00160c31;
    }
    if (pCVar9[2].m_registrationId == offendingCommandCorrelationId) {
      pCVar9 = pCVar9 + 2;
      goto LAB_00160c31;
    }
    if (pCVar9[3].m_registrationId == offendingCommandCorrelationId) {
      pCVar9 = pCVar9 + 3;
      goto LAB_00160c31;
    }
    pCVar9 = pCVar9 + 4;
    lVar6 = lVar6 + -0x180;
  }
  lVar6 = lVar6 / 0x60;
  if (lVar6 == 1) {
LAB_00160c12:
    if (pCVar9->m_registrationId != offendingCommandCorrelationId) {
      pCVar9 = pCVar4;
    }
  }
  else if (lVar6 == 2) {
LAB_00160c09:
    if (pCVar9->m_registrationId != offendingCommandCorrelationId) {
      pCVar9 = pCVar9 + 1;
      goto LAB_00160c12;
    }
  }
  else {
    if (lVar6 != 3) goto LAB_00160c4c;
    if (pCVar9->m_registrationId != offendingCommandCorrelationId) {
      pCVar9 = pCVar9 + 1;
      goto LAB_00160c09;
    }
  }
LAB_00160c31:
  if (pCVar9 != pCVar4) {
    pCVar9->m_status = ERRORED_MEDIA_DRIVER;
    pCVar9->m_errorCode = errorCode;
    std::__cxx11::string::_M_assign((string *)&pCVar9->m_errorMessage);
  }
LAB_00160c4c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onErrorResponse(
    std::int64_t offendingCommandCorrelationId,
    std::int32_t errorCode,
    const std::string& errorMessage)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [offendingCommandCorrelationId](const SubscriptionStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end())
    {
        (*subIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*subIt).m_errorCode = errorCode;
        (*subIt).m_errorMessage = errorMessage;
        return;
    }

    auto pubIt = std::find_if(m_publications.begin(), m_publications.end(),
        [offendingCommandCorrelationId](const PublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (pubIt != m_publications.end())
    {
        (*pubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*pubIt).m_errorCode = errorCode;
        (*pubIt).m_errorMessage = errorMessage;
        return;
    }

    auto exPubIt = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [offendingCommandCorrelationId](const ExclusivePublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (exPubIt != m_exclusivePublications.end())
    {
        (*exPubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*exPubIt).m_errorCode = errorCode;
        (*exPubIt).m_errorMessage = errorMessage;
        return;
    }

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [offendingCommandCorrelationId](const CounterStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end())
    {
        (*counterIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*counterIt).m_errorCode = errorCode;
        (*counterIt).m_errorMessage = errorMessage;
        return;
    }
}